

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
* __thiscall
gl3cts::ReservedNamesTest::getSupportedShaderTypes
          (vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
           *__return_storage_ptr__,ReservedNamesTest *this)

{
  bool bVar1;
  ContextType ctxType;
  anon_enum_32 local_1c;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  (__return_storage_ptr__->
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (bVar1) {
    local_1c = LANGUAGE_FEATURE_ATOMIC_COUNTER;
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::emplace_back<gl3cts::ReservedNamesTest::_shader_type>(__return_storage_ptr__,&local_1c);
  }
  local_1c = LANGUAGE_FEATURE_ATTRIBUTE;
  std::
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::emplace_back<gl3cts::ReservedNamesTest::_shader_type>(__return_storage_ptr__,&local_1c);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x123);
  if (bVar1) {
    local_1c = LANGUAGE_FEATURE_CONSTANT;
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::emplace_back<gl3cts::ReservedNamesTest::_shader_type>(__return_storage_ptr__,&local_1c);
  }
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x104);
  if (bVar1) {
    local_1c = LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME;
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::emplace_back<gl3cts::ReservedNamesTest::_shader_type>(__return_storage_ptr__,&local_1c);
    local_1c = LANGUAGE_FEATURE_FUNCTION_NAME;
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::emplace_back<gl3cts::ReservedNamesTest::_shader_type>(__return_storage_ptr__,&local_1c);
  }
  local_1c = LANGUAGE_FEATURE_INPUT;
  std::
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::emplace_back<gl3cts::ReservedNamesTest::_shader_type>(__return_storage_ptr__,&local_1c);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ReservedNamesTest::_shader_type> ReservedNamesTest::getSupportedShaderTypes() const
{
	const glu::ContextType	context_type = m_context.getRenderContext().getType();
	std::vector<_shader_type> result;

	/* CS: Available, starting with GL 4.3 */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		result.push_back(SHADER_TYPE_COMPUTE);
	}

	/* FS: Always supported */
	result.push_back(SHADER_TYPE_FRAGMENT);

	/* GS: Available, starting with GL 3.2 */
	if (glu::contextSupports(context_type, glu::ApiType::core(3, 2)))
	{
		result.push_back(SHADER_TYPE_GEOMETRY);
	}

	/* TC: Available, starting with GL 4.0 */
	/* TE: Available, starting with GL 4.0 */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 0)))
	{
		result.push_back(SHADER_TYPE_TESS_CONTROL);
		result.push_back(SHADER_TYPE_TESS_EVALUATION);
	}

	/* VS: Always supported */
	result.push_back(SHADER_TYPE_VERTEX);

	return result;
}